

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLcode Curl_multi_xfer_buf_borrow(Curl_easy *data,char **pbuf,size_t *pbuflen)

{
  undefined1 *puVar1;
  Curl_multi *pCVar2;
  char *pcVar3;
  ulong uVar4;
  
  *pbuf = (char *)0x0;
  *pbuflen = 0;
  pCVar2 = data->multi;
  if (pCVar2 == (Curl_multi *)0x0) {
    pcVar3 = "transfer has no multi handle";
  }
  else {
    uVar4 = (ulong)(data->set).buffer_size;
    if (uVar4 != 0) {
      if ((pCVar2->field_0x279 & 0x20) != 0) {
        Curl_failf(data,"attempt to borrow xfer_buf when already borrowed");
        return CURLE_AGAIN;
      }
      if ((pCVar2->xfer_buf != (char *)0x0) && (pCVar2->xfer_buf_len < uVar4)) {
        (*Curl_cfree)(pCVar2->xfer_buf);
        pCVar2 = data->multi;
        pCVar2->xfer_buf = (char *)0x0;
        pCVar2->xfer_buf_len = 0;
      }
      if (data->multi->xfer_buf == (char *)0x0) {
        pcVar3 = (char *)(*Curl_cmalloc)((ulong)(data->set).buffer_size);
        pCVar2 = data->multi;
        pCVar2->xfer_buf = pcVar3;
        if (pcVar3 == (char *)0x0) {
          Curl_failf(data,"could not allocate xfer_buf of %zu bytes");
          return CURLE_OUT_OF_MEMORY;
        }
        pCVar2->xfer_buf_len = (ulong)(data->set).buffer_size;
      }
      puVar1 = &data->multi->field_0x279;
      *puVar1 = *puVar1 | 0x20;
      *pbuf = data->multi->xfer_buf;
      *pbuflen = data->multi->xfer_buf_len;
      return CURLE_OK;
    }
    pcVar3 = "transfer buffer size is 0";
  }
  Curl_failf(data,pcVar3);
  return CURLE_FAILED_INIT;
}

Assistant:

CURLcode Curl_multi_xfer_buf_borrow(struct Curl_easy *data,
                                    char **pbuf, size_t *pbuflen)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->multi);
  *pbuf = NULL;
  *pbuflen = 0;
  if(!data->multi) {
    failf(data, "transfer has no multi handle");
    return CURLE_FAILED_INIT;
  }
  if(!data->set.buffer_size) {
    failf(data, "transfer buffer size is 0");
    return CURLE_FAILED_INIT;
  }
  if(data->multi->xfer_buf_borrowed) {
    failf(data, "attempt to borrow xfer_buf when already borrowed");
    return CURLE_AGAIN;
  }

  if(data->multi->xfer_buf &&
     data->set.buffer_size > data->multi->xfer_buf_len) {
    /* not large enough, get a new one */
    free(data->multi->xfer_buf);
    data->multi->xfer_buf = NULL;
    data->multi->xfer_buf_len = 0;
  }

  if(!data->multi->xfer_buf) {
    data->multi->xfer_buf = malloc((size_t)data->set.buffer_size);
    if(!data->multi->xfer_buf) {
      failf(data, "could not allocate xfer_buf of %zu bytes",
            (size_t)data->set.buffer_size);
      return CURLE_OUT_OF_MEMORY;
    }
    data->multi->xfer_buf_len = data->set.buffer_size;
  }

  data->multi->xfer_buf_borrowed = TRUE;
  *pbuf = data->multi->xfer_buf;
  *pbuflen = data->multi->xfer_buf_len;
  return CURLE_OK;
}